

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_WAKE(effect_handler_context_t_conflict *context)

{
  uint8_t uVar1;
  ushort uVar2;
  bool bVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  loc grid1;
  monster_conflict *mon;
  source origin;
  
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  grid1 = origin_get_loc(origin);
  wVar4 = cave_monster_max(cave);
  if (L'\x01' < wVar4) {
    wVar4 = L'\x01';
    bVar3 = false;
    do {
      mon = (monster_conflict *)cave_monster(cave,wVar4);
      if (mon->race != (monster_race *)0x0) {
        uVar1 = player->themed_level;
        uVar2 = z_info->max_sight;
        wVar5 = distance((loc_conflict)grid1,(loc_conflict)mon->grid);
        if ((wVar5 < (int)((uint)uVar2 << (uVar1 == '\0'))) && (mon->m_timed[0] != 0)) {
          monster_wake(mon,false,wVar5 * -2 + L'd');
          bVar3 = true;
        }
      }
      wVar4 = wVar4 + L'\x01';
      wVar5 = cave_monster_max(cave);
    } while (wVar4 < wVar5);
    if (bVar3) {
      msg("You hear a sudden stirring in the distance!");
    }
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_WAKE(effect_handler_context_t *context)
{
	int i;
	bool woken = false;

	struct loc origin = origin_get_loc(context->origin);

	/* Wake everyone nearby */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);
		if (mon->race) {
			int radius = player->themed_level ? z_info->max_sight :
				z_info->max_sight * 2;
			int dist = distance(origin, mon->grid);

			/* Skip monsters too far away */
			if ((dist < radius) && mon->m_timed[MON_TMD_SLEEP]) {
				/* Monster wakes, closer means likelier to become aware */
				monster_wake(mon, false, 100 - 2 * dist);
				woken = true;
			}
		}
	}

	/* Messages */
	if (woken) {
		msg("You hear a sudden stirring in the distance!");
	}

	context->ident = true;

	return true;
}